

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
           *this,DenseSetPair<llbuild::core::CancellationDelegate_*> *OldBucketsBegin,
          DenseSetPair<llbuild::core::CancellationDelegate_*> *OldBucketsEnd)

{
  CancellationDelegate *pCVar1;
  bool bVar2;
  CancellationDelegate **ppCVar3;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDStack_48;
  bool FoundVal;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *DestBucket;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *E;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *B;
  CancellationDelegate *TombstoneKey;
  CancellationDelegate *EmptyKey;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *OldBucketsEnd_local;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *OldBucketsBegin_local;
  DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
  *this_local;
  
  EmptyKey = (CancellationDelegate *)OldBucketsEnd;
  OldBucketsEnd_local = OldBucketsBegin;
  OldBucketsBegin_local = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)this;
  initEmpty(this);
  TombstoneKey = getEmptyKey();
  B = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)getTombstoneKey();
  E = OldBucketsEnd_local;
  DestBucket = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)EmptyKey;
  do {
    if (E == DestBucket) {
      return;
    }
    ppCVar3 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
    bVar2 = DenseMapInfo<llbuild::core::CancellationDelegate_*>::isEqual(*ppCVar3,TombstoneKey);
    if (!bVar2) {
      ppCVar3 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
      bVar2 = DenseMapInfo<llbuild::core::CancellationDelegate_*>::isEqual
                        (*ppCVar3,(CancellationDelegate *)B);
      if (!bVar2) {
        ppCVar3 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
        bVar2 = DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
                ::LookupBucketFor<llbuild::core::CancellationDelegate*>
                          ((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
                            *)this,ppCVar3,&stack0xffffffffffffffb8);
        if (bVar2) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                        ,0x176,
                        "void llvm::DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, BucketT = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>]"
                       );
        }
        ppCVar3 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
        pCVar1 = *ppCVar3;
        ppCVar3 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(pDStack_48);
        *ppCVar3 = pCVar1;
        detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getSecond(pDStack_48);
        detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getSecond(E);
        incrementNumEntries(this);
        detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getSecond(E);
      }
    }
    detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
    E = E + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }